

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall
QHttp2Connection::connectionError(QHttp2Connection *this,Http2Error errorCode,char *message)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  long lVar4;
  QHttp2Stream *this_00;
  QLatin1StringView latin1;
  ulong uVar5;
  long in_FS_OFFSET;
  piter local_78;
  QLatin1String local_68;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x2a9] == (QHttp2Connection)0x0) {
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledCritical._q_value._M_base._M_i & 1
        ) != 0) {
      local_50.d._0_4_ = 2;
      local_50._4_8_ = 0;
      local_50._12_8_ = 0;
      local_50.size._4_4_ = 0;
      local_38 = qHttp2ConnectionLog::category.name;
      QMessageLogger::critical
                ((char *)&local_50,"[%p] Connection error: %s (%d)",this,message,errorCode);
    }
    this[0x2a9] = (QHttp2Connection)0x1;
    sendGOAWAY(this,errorCode);
    local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String(&local_68,message);
    local_78 = (piter)QHash<unsigned_int,_QPointer<QHttp2Stream>_>::begin
                                ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)(this + 0x1c0));
    while( true ) {
      if (local_78.d == (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0 &&
          local_78.bucket == 0) break;
      pSVar2 = (local_78.d)->spans;
      uVar5 = local_78.bucket >> 7;
      pEVar3 = pSVar2[uVar5].entries;
      bVar1 = pSVar2[uVar5].offsets[(uint)local_78.bucket & 0x7f];
      lVar4 = *(long *)(pEVar3[bVar1].storage.data + 8);
      if ((((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
          (this_00 = *(QHttp2Stream **)(pEVar3[bVar1].storage.data + 0x10),
          this_00 != (QHttp2Stream *)0x0)) &&
         ((*(int *)(this_00 + 0x68) != 0 && (*(int *)(this_00 + 0x68) != 5)))) {
        latin1.m_data = local_68.m_data;
        latin1.m_size = local_68.m_size;
        QString::QString((QString *)&local_50,latin1);
        QHttp2Stream::finishWithError(this_00,errorCode,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
      QHashPrivate::iterator<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_>::operator++
                (&local_78);
    }
    connectionClosed(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::connectionError(Http2Error errorCode, const char *message)
{
    Q_ASSERT(message);
    // RFC 9113, 6.8: An endpoint MAY send multiple GOAWAY frames if circumstances change.
    // Anyway, we do not send multiple GOAWAY frames.
    if (m_goingAway)
        return;

    qCCritical(qHttp2ConnectionLog, "[%p] Connection error: %s (%d)", this, message,
               int(errorCode));

    // RFC 9113, 6.8: Endpoints SHOULD always send a GOAWAY frame before closing a connection so
    // that the remote peer can know whether a stream has been partially processed or not.
    m_goingAway = true;
    sendGOAWAY(errorCode);
    auto messageView = QLatin1StringView(message);

    for (QHttp2Stream *stream : std::as_const(m_streams)) {
        if (stream && stream->isActive())
            stream->finishWithError(errorCode, messageView);
    }

    closeSession();
}